

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

SASL_RESPONSE_HANDLE sasl_response_clone(SASL_RESPONSE_HANDLE value)

{
  AMQP_VALUE pAVar1;
  SASL_RESPONSE_HANDLE local_18;
  SASL_RESPONSE_INSTANCE *sasl_response_instance;
  SASL_RESPONSE_HANDLE value_local;
  
  local_18 = (SASL_RESPONSE_HANDLE)malloc(8);
  if (local_18 != (SASL_RESPONSE_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (SASL_RESPONSE_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

SASL_RESPONSE_HANDLE sasl_response_clone(SASL_RESPONSE_HANDLE value)
{
    SASL_RESPONSE_INSTANCE* sasl_response_instance = (SASL_RESPONSE_INSTANCE*)malloc(sizeof(SASL_RESPONSE_INSTANCE));
    if (sasl_response_instance != NULL)
    {
        sasl_response_instance->composite_value = amqpvalue_clone(((SASL_RESPONSE_INSTANCE*)value)->composite_value);
        if (sasl_response_instance->composite_value == NULL)
        {
            free(sasl_response_instance);
            sasl_response_instance = NULL;
        }
    }

    return sasl_response_instance;
}